

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_AccuracyFactor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  char *__assertion;
  bool bVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar4 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar1[1];
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00436d80;
        }
      }
      if (numret < 1) {
        iVar3 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1ea1,
                        "int AF_AActor_AccuracyFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\x01') {
          __assert_fail("RegType == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x144,"void VMReturn::SetFloat(double)");
        }
        *(double *)ret->Location =
             1.0 / (double)(1 << ((char)(uint)((ulong)((long)*(int *)((long)puVar1 + 0x2ac) *
                                                      0x66666667) >> 0x23) -
                                  (char)(*(int *)((long)puVar1 + 0x2ac) >> 0x1f) & 0x1fU));
        iVar3 = 1;
      }
      return iVar3;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00436d80:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1ea0,
                "int AF_AActor_AccuracyFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AccuracyFactor)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_FLOAT(self->AccuracyFactor());
}